

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc16.cpp
# Opt level: O0

uint16_t crc_modbus(uchar *input_str,size_t num_bytes)

{
  ulong local_30;
  size_t a;
  uchar *ptr;
  uint16_t crc;
  size_t num_bytes_local;
  uchar *input_str_local;
  
  if (!crc_tab16_init) {
    init_crc16_tab();
  }
  ptr._6_2_ = 0xffff;
  if (input_str != (uchar *)0x0) {
    a = (size_t)input_str;
    for (local_30 = 0; local_30 < num_bytes; local_30 = local_30 + 1) {
      ptr._6_2_ = ptr._6_2_ >> 8 ^ crc_tab16[(int)((ushort)(ptr._6_2_ ^ *(byte *)a) & 0xff)];
      a = a + 1;
    }
  }
  return ptr._6_2_;
}

Assistant:

uint16_t crc_modbus(const unsigned char *input_str, size_t num_bytes) {
  uint16_t crc;
  const unsigned char *ptr;
  size_t a;

  if (!crc_tab16_init) init_crc16_tab();

  crc = CRC_START_MODBUS;
  ptr = input_str;

  if (ptr != NULL)
    for (a = 0; a < num_bytes; a++) {
      crc = (crc >> 8) ^ crc_tab16[(crc ^ (uint16_t)*ptr++) & 0x00FF];
    }

  return crc;

}